

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountingStorageItemRegister.hpp
# Opt level: O3

int __thiscall
supermap::
CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
::clone(CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined4 uVar1;
  _func_int *in_RAX;
  _func_int **pp_Var2;
  _func_int *local_28;
  
  local_28 = in_RAX;
  pp_Var2 = (_func_int **)operator_new(0x18);
  uVar1 = *(undefined4 *)(__fn + 8);
  (**(code **)**(undefined8 **)(__fn + 0x10))(&local_28);
  *pp_Var2 = (_func_int *)&PTR_clone_001feb40;
  *(undefined4 *)(pp_Var2 + 1) = uVar1;
  pp_Var2[2] = local_28;
  (this->
  super_StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_supermap::CountingStorageInfo<unsigned_int,_void>_>
  ).
  super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_supermap::CountingStorageInfo<unsigned_int,_void>_>_>
  ._vptr_Cloneable = pp_Var2;
  return (int)this;
}

Assistant:

std::unique_ptr<StorageItemRegister<T, CountingStorageInfo<IndexT, AdditionalInfo>>>
    clone() const override {
        return std::unique_ptr<CountingStorageItemRegister<T, IndexT, AdditionalInfo>>(
            new CountingStorageItemRegister(count_,
                                            innerRegister_->clone())
        );
    }